

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O2

Params * adios2::helper::LowerCaseParams(Params *__return_storage_ptr__,Params *params)

{
  _Rb_tree_header *p_Var1;
  string *in_RDX;
  _Base_ptr p_Var2;
  undefined1 auVar3 [16];
  string sStack_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (params->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var2 != &(params->_M_t)._M_impl.super__Rb_tree_header) {
    LowerCase<std::__cxx11::string>(&sStack_88,(helper *)(p_Var2 + 1),in_RDX);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_68,&sStack_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 2));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)__return_storage_ptr__,&local_68);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_68);
    std::__cxx11::string::~string((string *)&sStack_88);
    auVar3 = std::_Rb_tree_increment(p_Var2);
    in_RDX = auVar3._8_8_;
    p_Var2 = auVar3._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

Params LowerCaseParams(const Params &params)
{
    // Keys cannot be changed in maps, so if we get an uppercase key, we have to
    // copy the entire map.
    Params lower_case_params;
    for (auto &p : params)
    {
        // The values cannot be changed to lower case, because third-party
        // libraries (like PNG) require arguments like "PNG_COLOR_TYPE_" . .
        lower_case_params.insert({LowerCase(p.first), p.second});
    }
    return lower_case_params;
}